

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Release(ShardedLRUCache *this,Handle *handle)

{
  undefined8 in_RDI;
  long in_FS_OFFSET;
  LRUCache *unaff_retaddr;
  LRUHandle *h;
  Handle *handle_00;
  
  handle_00 = *(Handle **)(in_FS_OFFSET + 0x28);
  Shard((uint32_t)((ulong)in_RDI >> 0x20));
  LRUCache::Release(unaff_retaddr,handle_00);
  if (*(Handle **)(in_FS_OFFSET + 0x28) == handle_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Release(Handle* handle) override {
    LRUHandle* h = reinterpret_cast<LRUHandle*>(handle);
    shard_[Shard(h->hash)].Release(handle);
  }